

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::UniformCase::writeUniformDefinitions(UniformCase *this,ostringstream *dst)

{
  UniformCollection *pUVar1;
  pointer pUVar2;
  char *__s;
  undefined8 uVar3;
  char cVar4;
  bool bVar5;
  pointer ppSVar6;
  ostream *poVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  allocator<char> local_a1;
  UniformCase *local_a0;
  StructType *local_98;
  string local_90;
  DeclareVariable local_70;
  
  pUVar1 = (this->m_uniformCollection).m_ptr;
  ppSVar6 = (pUVar1->m_structTypes).
            super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pUVar1->m_structTypes).
                              super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar6) >> 3)) {
    lVar9 = 0;
    do {
      local_70.varType._0_8_ = ppSVar6[lVar9];
      local_70.varType.m_data.basic.type = TYPE_INVALID;
      poVar7 = glu::decl::operator<<((ostream *)dst,(DeclareStructTypePtr *)&local_70);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,";\n",2);
      lVar9 = lVar9 + 1;
      pUVar1 = (this->m_uniformCollection).m_ptr;
      ppSVar6 = (pUVar1->m_structTypes).
                super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar9 < (int)((ulong)((long)(pUVar1->m_structTypes).
                                         super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar6)
                          >> 3));
  }
  pUVar1 = (this->m_uniformCollection).m_ptr;
  local_a0 = this;
  if (0 < (int)((ulong)((long)(pUVar1->m_uniforms).
                              super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pUVar1->m_uniforms).
                             super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249) {
    lVar10 = 0x20;
    lVar9 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)dst,"uniform ",8);
      pUVar1 = (this->m_uniformCollection).m_ptr;
      pUVar2 = (pUVar1->m_uniforms).
               super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,
                 *(char **)((long)(pUVar1->m_uniforms).
                                  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar10 + -0x20),
                 &local_a1);
      glu::decl::DeclareVariable::DeclareVariable
                (&local_70,(VarType *)((long)&pUVar2->name + lVar10),&local_90,0);
      poVar7 = glu::decl::operator<<((ostream *)dst,&local_70);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,";\n",2);
      this = local_a0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.name._M_dataplus._M_p != &local_70.name.field_2) {
        operator_delete(local_70.name._M_dataplus._M_p,
                        local_70.name.field_2._M_allocated_capacity + 1);
      }
      glu::VarType::~VarType(&local_70.varType);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      lVar9 = lVar9 + 1;
      pUVar1 = (this->m_uniformCollection).m_ptr;
      lVar10 = lVar10 + 0x38;
    } while (lVar9 < (int)((ulong)((long)(pUVar1->m_uniforms).
                                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pUVar1->m_uniforms).
                                        super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     -0x49249249);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)dst,"\n",1);
  anon_unknown_1::UniformCollection::getSamplerTypes
            ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_70,
             (this->m_uniformCollection).m_ptr);
  uVar3 = local_70.varType._0_8_;
  local_98 = (StructType *)
             CONCAT44(local_70.varType.m_data.basic.precision,local_70.varType.m_data.basic.type);
  if ((StructType *)local_70.varType._0_8_ != (StructType *)0x0) {
    operator_delete((void *)local_70.varType._0_8_,
                    local_70.varType.m_data._8_8_ - local_70.varType._0_8_);
  }
  lVar9 = 0;
  do {
    if ((StructType *)uVar3 == local_98) {
LAB_00382bc1:
      bVar5 = anon_unknown_1::UniformCollection::containsMatchingBasicType
                        ((local_a0->m_uniformCollection).m_ptr,
                         *(dataTypePredicate *)
                          ((long)writeUniformDefinitions::compareFuncs[0].requiringTypes + lVar9));
      if (bVar5) goto LAB_00382bf4;
      bVar5 = anon_unknown_1::UniformCollection::containsMatchingBasicType
                        ((local_a0->m_uniformCollection).m_ptr,
                         *(dataTypePredicate *)
                          ((long)writeUniformDefinitions::compareFuncs[0].requiringTypes + lVar9 + 8
                          ));
      if (bVar5) goto LAB_00382bf4;
    }
    else {
      cVar4 = (**(code **)((long)writeUniformDefinitions::compareFuncs[0].requiringTypes + lVar9))
                        (4);
      if (cVar4 == '\0') {
        cVar4 = (**(code **)((long)writeUniformDefinitions::compareFuncs[0].requiringTypes +
                            lVar9 + 8))(4);
        if (cVar4 == '\0') goto LAB_00382bc1;
      }
LAB_00382bf4:
      __s = *(char **)((long)writeUniformDefinitions::compareFuncs[0].requiringTypes + lVar9 + 0x10)
      ;
      if (__s == (char *)0x0) {
        std::ios::clear((int)dst + (int)*(undefined8 *)(*(long *)dst + -0x18));
      }
      else {
        sVar8 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)dst,__s,sVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)dst,"\n",1);
    }
    lVar9 = lVar9 + 0x18;
    if (lVar9 == 0x168) {
      return;
    }
  } while( true );
}

Assistant:

void UniformCase::writeUniformDefinitions (std::ostringstream& dst) const
{
	for (int i = 0; i < (int)m_uniformCollection->getNumStructTypes(); i++)
		dst << glu::declare(m_uniformCollection->getStructType(i)) << ";\n";

	for (int i = 0; i < (int)m_uniformCollection->getNumUniforms(); i++)
		dst << "uniform " << glu::declare(m_uniformCollection->getUniform(i).type, m_uniformCollection->getUniform(i).name.c_str()) << ";\n";

	dst << "\n";

	{
		static const struct
		{
			dataTypePredicate	requiringTypes[2];
			const char*			definition;
		} compareFuncs[] =
		{
			{ { glu::isDataTypeFloatOrVec,				glu::isDataTypeMatrix				}, "mediump float compare_float    (mediump float a, mediump float b)  { return abs(a - b) < 0.05 ? 1.0 : 0.0; }"																		},
			{ { dataTypeEquals<glu::TYPE_FLOAT_VEC2>,	dataTypeIsMatrixWithNRows<2>		}, "mediump float compare_vec2     (mediump vec2 a, mediump vec2 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y); }"														},
			{ { dataTypeEquals<glu::TYPE_FLOAT_VEC3>,	dataTypeIsMatrixWithNRows<3>		}, "mediump float compare_vec3     (mediump vec3 a, mediump vec3 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y)*compare_float(a.z, b.z); }"								},
			{ { dataTypeEquals<glu::TYPE_FLOAT_VEC4>,	dataTypeIsMatrixWithNRows<4>		}, "mediump float compare_vec4     (mediump vec4 a, mediump vec4 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y)*compare_float(a.z, b.z)*compare_float(a.w, b.w); }"		},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT2>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat2     (mediump mat2 a, mediump mat2 b)    { return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1]); }"													},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT3>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat3     (mediump mat3 a, mediump mat3 b)    { return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1])*compare_vec3(a[2], b[2]); }"							},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT4>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat4     (mediump mat4 a, mediump mat4 b)    { return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1])*compare_vec4(a[2], b[2])*compare_vec4(a[3], b[3]); }"	},
			{ { dataTypeEquals<glu::TYPE_INT>,			dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_int      (mediump int a, mediump int b)      { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_INT_VEC2>,		dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_ivec2    (mediump ivec2 a, mediump ivec2 b)  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_INT_VEC3>,		dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_ivec3    (mediump ivec3 a, mediump ivec3 b)  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_INT_VEC4>,		dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_ivec4    (mediump ivec4 a, mediump ivec4 b)  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_BOOL>,			dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_bool     (bool a, bool b)                    { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_BOOL_VEC2>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_bvec2    (bvec2 a, bvec2 b)                  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_BOOL_VEC3>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_bvec3    (bvec3 a, bvec3 b)                  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_BOOL_VEC4>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_bvec4    (bvec4 a, bvec4 b)                  { return a == b ? 1.0 : 0.0; }"																					}
		};

		const bool containsSamplers = !m_uniformCollection->getSamplerTypes().empty();

		for (int compFuncNdx = 0; compFuncNdx < DE_LENGTH_OF_ARRAY(compareFuncs); compFuncNdx++)
		{
			const dataTypePredicate		(&typeReq)[2]			= compareFuncs[compFuncNdx].requiringTypes;
			const bool					containsTypeSampler		= containsSamplers && (typeReq[0](glu::TYPE_FLOAT_VEC4) || typeReq[1](glu::TYPE_FLOAT_VEC4));

			if (containsTypeSampler || m_uniformCollection->containsMatchingBasicType(typeReq[0]) || m_uniformCollection->containsMatchingBasicType(typeReq[1]))
				dst << compareFuncs[compFuncNdx].definition << "\n";
		}
	}
}